

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<std::__cxx11::string,char[2]>
          (string *__return_storage_ptr__,internal *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          char (*param_2) [2])

{
  char (*param_1_local) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  
  PrintToString<std::__cxx11::string>(__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}